

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

char * Bac_ObjNameStr(Bac_Ntk_t *p,int i)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = Bac_ObjName(p,i);
  if (uVar1 == 0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                  ,0x107,"Bac_NameType_t Bac_NameType(int)");
  }
  if ((int)uVar1 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x13e,"int Abc_Lit2Att2(int)");
  }
  if ((uVar1 & 2) != 0) {
    __assert_fail("Bac_ObjNameType(p, i) <= BAC_NAME_WORD",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                  ,0x123,"char *Bac_ObjNameStr(Bac_Ntk_t *, int)");
  }
  uVar1 = Bac_ObjName(p,i);
  if (-1 < (int)uVar1) {
    pcVar2 = Abc_NamStr(p->pDesign->pStrs,uVar1 >> 2);
    return pcVar2;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x13d,"int Abc_Lit2Var2(int)");
}

Assistant:

static inline char *         Bac_ObjNameStr( Bac_Ntk_t * p, int i )          { assert(Bac_ObjNameType(p, i) <= BAC_NAME_WORD); return Bac_NtkStr(p, Bac_ObjNameId(p, i));  }